

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::InvalidBinsSelectExpr>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          InvalidBinsSelectExpr *t)

{
  bool bVar1;
  InvalidBinsSelectExpr *in_RSI;
  ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *in_RDI;
  
  bVar1 = BinsSelectExpr::bad(&in_RSI->super_BinsSelectExpr);
  if (!bVar1) {
    visitDefault<slang::ast::InvalidBinsSelectExpr>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }